

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

void std::
     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_prune.cpp:625:22)>
     ::_M_invoke(_Any_data *__functor)

{
  fwrite("Fossilize INFO: Usage: fossilize-prune\n\t[--input-db path]\n\t[--output-db path]\n\t[--filter-application hash]\n\t[--filter-graphics hash]\n\t[--filter-compute hash]\n\t[--filter-raytracing hash]\n\t[--filter-module hash]\n\t[--filter-timestamp path seconds] (seconds is relative to current time. E.g., if 100, any entry made more than 100 seconds ago are pruned)\n\t[--skip-graphics hash]\n\t[--skip-compute hash]\n\t[--skip-raytracing hash]\n\t[--skip-module hash]\n\t[--skip-application-info-links]\n\t[--whitelist whitelist.foz]\n\t[--blacklist blacklist.foz]\n\t[--invert-module-pruning]\n"
         ,0x233,1,_stderr);
  return;
}

Assistant:

static void print_help()
{
	LOGI("Usage: fossilize-prune\n"
	     "\t[--input-db path]\n"
	     "\t[--output-db path]\n"
	     "\t[--filter-application hash]\n"
	     "\t[--filter-graphics hash]\n"
	     "\t[--filter-compute hash]\n"
	     "\t[--filter-raytracing hash]\n"
	     "\t[--filter-module hash]\n"
	     "\t[--filter-timestamp path seconds] (seconds is relative to current time. E.g., if 100, any entry made more than 100 seconds ago are pruned)\n"
	     "\t[--skip-graphics hash]\n"
	     "\t[--skip-compute hash]\n"
	     "\t[--skip-raytracing hash]\n"
	     "\t[--skip-module hash]\n"
	     "\t[--skip-application-info-links]\n"
	     "\t[--whitelist whitelist.foz]\n"
	     "\t[--blacklist blacklist.foz]\n"
	     "\t[--invert-module-pruning]\n");
}